

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommMPI.cpp
# Opt level: O0

void __thiscall
adios2::helper::CommImplMPI::Allgatherv
          (CommImplMPI *this,void *sendbuf,size_t sendcount,Datatype sendtype,void *recvbuf,
          size_t *recvcounts,size_t *displs,Datatype recvtype,string *hint)

{
  int iVar1;
  back_insert_iterator<std::vector<int,_std::allocator<int>_>_> bVar2;
  MPI_Datatype poVar3;
  int *piVar4;
  int *piVar5;
  MPI_Datatype poVar6;
  Datatype in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long *in_RDI;
  vector<int,_std::allocator<int>_> *in_R8;
  long in_R9;
  long in_stack_00000008;
  Datatype in_stack_00000010;
  string *in_stack_00000018;
  int in_stack_00000024;
  int size;
  anon_class_1_0_00000001 cast;
  vector<int,_std::allocator<int>_> displsInt;
  vector<int,_std::allocator<int>_> countsInt;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffeb8;
  size_type in_stack_fffffffffffffee8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffef0;
  
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1a09aa);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1a09b7);
  iVar1 = (**(code **)(*in_RDI + 0x40))();
  std::vector<int,_std::allocator<int>_>::reserve
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  bVar2 = std::back_inserter<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffffeb8);
  std::
  transform<unsigned_long_const*,std::back_insert_iterator<std::vector<int,std::allocator<int>>>,adios2::helper::CommImplMPI::Allgatherv(void_const*,unsigned_long,adios2::helper::CommImpl::Datatype,void*,unsigned_long_const*,unsigned_long_const*,adios2::helper::CommImpl::Datatype,std::__cxx11::string_const&)const::__0>
            (in_R9,in_R9 + (long)iVar1 * 8,bVar2.container);
  std::vector<int,_std::allocator<int>_>::reserve
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  bVar2 = std::back_inserter<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffffeb8);
  std::
  transform<unsigned_long_const*,std::back_insert_iterator<std::vector<int,std::allocator<int>>>,adios2::helper::CommImplMPI::Allgatherv(void_const*,unsigned_long,adios2::helper::CommImpl::Datatype,void*,unsigned_long_const*,unsigned_long_const*,adios2::helper::CommImpl::Datatype,std::__cxx11::string_const&)const::__0>
            (in_stack_00000008,in_stack_00000008 + (long)iVar1 * 8,bVar2.container);
  poVar3 = anon_unknown_1::ToMPI(in_ECX);
  piVar4 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x1a0b32);
  piVar5 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x1a0b44);
  poVar6 = anon_unknown_1::ToMPI(in_stack_00000010);
  MPI_Allgatherv(in_RSI,in_EDX,poVar3,in_R8,piVar4,piVar5,poVar6,in_RDI[1]);
  anon_unknown_1::CheckMPIReturn(in_stack_00000024,in_stack_00000018);
  std::vector<int,_std::allocator<int>_>::~vector(in_R8);
  std::vector<int,_std::allocator<int>_>::~vector(in_R8);
  return;
}

Assistant:

void CommImplMPI::Allgatherv(const void *sendbuf, size_t sendcount, Datatype sendtype,
                             void *recvbuf, const size_t *recvcounts, const size_t *displs,
                             Datatype recvtype, const std::string &hint) const
{
    std::vector<int> countsInt;
    std::vector<int> displsInt;
    {
        auto cast = [](size_t sz) -> int { return int(sz); };
        const int size = this->Size();
        countsInt.reserve(size);
        std::transform(recvcounts, recvcounts + size, std::back_inserter(countsInt), cast);
        displsInt.reserve(size);
        std::transform(displs, displs + size, std::back_inserter(displsInt), cast);
    }
    CheckMPIReturn(MPI_Allgatherv(sendbuf, static_cast<int>(sendcount), ToMPI(sendtype), recvbuf,
                                  countsInt.data(), displsInt.data(), ToMPI(recvtype), m_MPIComm),
                   hint);
}